

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O2

void __thiscall UnicodeTest_Illegal_Test::UnicodeTest_Illegal_Test(UnicodeTest_Illegal_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00199328;
  return;
}

Assistant:

TEST(UnicodeTest, Illegal) {
  string s = "123\x80";
  RuneStrArray runes;
  ASSERT_FALSE(DecodeRunesInString(s, runes));
  string actual;
  string expected = "[]";
  actual << runes;
  ASSERT_EQ(expected, actual);
}